

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::image_type_glsl_abi_cxx11_
          (CompilerGLSL *this,SPIRType *type,uint32_t id,bool param_3)

{
  bool bVar1;
  uint32_t uVar2;
  SPIRType *pSVar3;
  CompilerError *pCVar4;
  uint32_t id_00;
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  SPIRType *type_00;
  char *pcVar5;
  char *local_378;
  allocator local_321;
  string local_320 [39];
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [39];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [32];
  undefined1 local_238 [8];
  SPIRType sampled_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [48];
  string local_50 [8];
  string res;
  SPIRType *imagetype;
  bool param_3_local;
  uint32_t id_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  type_00 = (SPIRType *)CONCAT44(in_register_00000014,id);
  id_00 = (uint32_t)CONCAT71(in_register_00000009,param_3);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type_00->image);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar2);
  ::std::__cxx11::string::string(local_50);
  switch(pSVar3->basetype) {
  case SByte:
  case Short:
  case Int:
    ::std::__cxx11::string::operator=(local_50,"i");
    break;
  case UByte:
  case UShort:
  case UInt:
    ::std::__cxx11::string::operator=(local_50,"u");
    break;
  case Int64:
    ::std::__cxx11::string::operator=(local_50,"i64");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_80,"GL_EXT_shader_image_int64",&local_81);
    require_extension_internal((CompilerGLSL *)type,(string *)local_80);
    ::std::__cxx11::string::~string(local_80);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
    break;
  case UInt64:
    ::std::__cxx11::string::operator=(local_50,"u64");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_a8,"GL_EXT_shader_image_int64",&local_a9);
    require_extension_internal((CompilerGLSL *)type,(string *)local_a8);
    ::std::__cxx11::string::~string(local_a8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  }
  if (((type_00->basetype == Image) && ((type_00->image).dim == DimSubpassData)) &&
     ((type[0x15].member_type_index_redirection.stack_storage.aligned_char[0x18] & 1U) != 0)) {
    ::std::operator+(local_d0,(char *)local_50);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)local_d0);
    ::std::__cxx11::string::~string((string *)local_d0);
    sampled_type.member_name_cache._M_h._M_single_bucket._4_4_ = 1;
  }
  else if (((type_00->basetype == Image) && ((type_00->image).dim == DimSubpassData)) &&
          (bVar1 = subpass_input_is_framebuffer_fetch((CompilerGLSL *)type,id_00), bVar1)) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type_00->image);
    pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,uVar2);
    SPIRType::SPIRType((SPIRType *)local_238,pSVar3);
    sampled_type.basetype = UByte;
    (*(type->super_IVariant)._vptr_IVariant[0x13])(this,type,local_238,0);
    sampled_type.member_name_cache._M_h._M_single_bucket._4_4_ = 1;
    SPIRType::~SPIRType((SPIRType *)local_238);
  }
  else {
    if ((type_00->basetype == Image) && ((type_00->image).dim != DimSubpassData)) {
      if (((type_00->image).dim == DimBuffer) && ((type_00->image).sampled == 1)) {
        ::std::__cxx11::string::operator+=(local_50,"sampler");
      }
      else {
        pcVar5 = "texture";
        if ((type_00->image).sampled == 2) {
          pcVar5 = "image";
        }
        ::std::__cxx11::string::operator+=(local_50,pcVar5);
      }
    }
    else {
      ::std::__cxx11::string::operator+=(local_50,"sampler");
    }
    switch((type_00->image).dim) {
    case Dim1D:
      if ((type[0x15].member_type_index_redirection.stack_storage.aligned_char[0x10] & 1U) == 0) {
        local_378 = "iimage1D";
      }
      else {
        local_378 = "iimage2D";
      }
      local_378 = local_378 + 6;
      ::std::__cxx11::string::operator+=(local_50,local_378);
      break;
    case Dim2D:
      ::std::__cxx11::string::operator+=(local_50,"2D");
      break;
    case Dim3D:
      ::std::__cxx11::string::operator+=(local_50,"3D");
      break;
    case DimCube:
      ::std::__cxx11::string::operator+=(local_50,"Cube");
      break;
    case DimRect:
      if ((type[0x15].member_type_index_redirection.stack_storage.aligned_char[0x10] & 1U) != 0) {
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar4,"Rectangle textures are not supported on OpenGL ES.");
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      bVar1 = is_legacy_desktop((CompilerGLSL *)type);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_258,"GL_ARB_texture_rectangle",&local_259);
        require_extension_internal((CompilerGLSL *)type,(string *)local_258);
        ::std::__cxx11::string::~string(local_258);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_259);
      }
      ::std::__cxx11::string::operator+=(local_50,"2DRect");
      break;
    case DimBuffer:
      if (((type[0x15].member_type_index_redirection.stack_storage.aligned_char[0x10] & 1U) == 0) ||
         (0x13f < *(uint *)(type[0x15].member_type_index_redirection.stack_storage.aligned_char +
                           0xc))) {
        if (((type[0x15].member_type_index_redirection.stack_storage.aligned_char[0x10] & 1U) == 0)
           && (*(uint *)(type[0x15].member_type_index_redirection.stack_storage.aligned_char + 0xc)
               < 0x8c)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_2a8,"GL_EXT_texture_buffer_object",&local_2a9);
          require_extension_internal((CompilerGLSL *)type,(string *)local_2a8);
          ::std::__cxx11::string::~string(local_2a8);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
        }
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_280,"GL_EXT_texture_buffer",&local_281);
        require_extension_internal((CompilerGLSL *)type,(string *)local_280);
        ::std::__cxx11::string::~string(local_280);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_281);
      }
      ::std::__cxx11::string::operator+=(local_50,"Buffer");
      break;
    case DimSubpassData:
      ::std::__cxx11::string::operator+=(local_50,"2D");
      break;
    default:
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar4,"Only 1D, 2D, 2DRect, 3D, Buffer, InputTarget and Cube textures supported.")
      ;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if (((type_00->image).ms & 1U) != 0) {
      ::std::__cxx11::string::operator+=(local_50,"MS");
    }
    if (((type_00->image).arrayed & 1U) != 0) {
      bVar1 = is_legacy_desktop((CompilerGLSL *)type);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_2d0,"GL_EXT_texture_array",&local_2d1);
        require_extension_internal((CompilerGLSL *)type,(string *)local_2d0);
        ::std::__cxx11::string::~string(local_2d0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      }
      ::std::__cxx11::string::operator+=(local_50,"Array");
    }
    if ((((type_00->basetype == SampledImage) || (type_00->basetype == Sampler)) &&
        (bVar1 = Compiler::is_depth_image((Compiler *)type,type_00,id_00), bVar1)) &&
       ((::std::__cxx11::string::operator+=(local_50,"Shadow"), (type_00->image).dim == DimCube &&
        (bVar1 = is_legacy((CompilerGLSL *)type), bVar1)))) {
      if ((type[0x15].member_type_index_redirection.stack_storage.aligned_char[0x10] & 1U) == 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_2f8,"GL_EXT_gpu_shader4",&local_2f9);
        require_extension_internal((CompilerGLSL *)type,(string *)local_2f8);
        ::std::__cxx11::string::~string(local_2f8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
      }
      else {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_320,"GL_NV_shadow_samplers_cube",&local_321);
        require_extension_internal((CompilerGLSL *)type,(string *)local_320);
        ::std::__cxx11::string::~string(local_320);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_321);
        ::std::__cxx11::string::operator+=(local_50,"NV");
      }
    }
    ::std::__cxx11::string::string((string *)this,local_50);
    sampled_type.member_name_cache._M_h._M_single_bucket._4_4_ = 1;
  }
  ::std::__cxx11::string::~string(local_50);
  return this;
}

Assistant:

string CompilerGLSL::image_type_glsl(const SPIRType &type, uint32_t id, bool /*member*/)
{
	auto &imagetype = get<SPIRType>(type.image.type);
	string res;

	switch (imagetype.basetype)
	{
	case SPIRType::Int64:
		res = "i64";
		require_extension_internal("GL_EXT_shader_image_int64");
		break;
	case SPIRType::UInt64:
		res = "u64";
		require_extension_internal("GL_EXT_shader_image_int64");
		break;
	case SPIRType::Int:
	case SPIRType::Short:
	case SPIRType::SByte:
		res = "i";
		break;
	case SPIRType::UInt:
	case SPIRType::UShort:
	case SPIRType::UByte:
		res = "u";
		break;
	default:
		break;
	}

	// For half image types, we will force mediump for the sampler, and cast to f16 after any sampling operation.
	// We cannot express a true half texture type in GLSL. Neither for short integer formats for that matter.

	if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData && options.vulkan_semantics)
		return res + "subpassInput" + (type.image.ms ? "MS" : "");
	else if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData &&
	         subpass_input_is_framebuffer_fetch(id))
	{
		SPIRType sampled_type = get<SPIRType>(type.image.type);
		sampled_type.vecsize = 4;
		return type_to_glsl(sampled_type);
	}

	// If we're emulating subpassInput with samplers, force sampler2D
	// so we don't have to specify format.
	if (type.basetype == SPIRType::Image && type.image.dim != DimSubpassData)
	{
		// Sampler buffers are always declared as samplerBuffer even though they might be separate images in the SPIR-V.
		if (type.image.dim == DimBuffer && type.image.sampled == 1)
			res += "sampler";
		else
			res += type.image.sampled == 2 ? "image" : "texture";
	}
	else
		res += "sampler";

	switch (type.image.dim)
	{
	case Dim1D:
		// ES doesn't support 1D. Fake it with 2D.
		res += options.es ? "2D" : "1D";
		break;
	case Dim2D:
		res += "2D";
		break;
	case Dim3D:
		res += "3D";
		break;
	case DimCube:
		res += "Cube";
		break;
	case DimRect:
		if (options.es)
			SPIRV_CROSS_THROW("Rectangle textures are not supported on OpenGL ES.");

		if (is_legacy_desktop())
			require_extension_internal("GL_ARB_texture_rectangle");

		res += "2DRect";
		break;

	case DimBuffer:
		if (options.es && options.version < 320)
			require_extension_internal("GL_EXT_texture_buffer");
		else if (!options.es && options.version < 140)
			require_extension_internal("GL_EXT_texture_buffer_object");
		res += "Buffer";
		break;

	case DimSubpassData:
		res += "2D";
		break;
	default:
		SPIRV_CROSS_THROW("Only 1D, 2D, 2DRect, 3D, Buffer, InputTarget and Cube textures supported.");
	}

	if (type.image.ms)
		res += "MS";
	if (type.image.arrayed)
	{
		if (is_legacy_desktop())
			require_extension_internal("GL_EXT_texture_array");
		res += "Array";
	}

	// "Shadow" state in GLSL only exists for samplers and combined image samplers.
	if (((type.basetype == SPIRType::SampledImage) || (type.basetype == SPIRType::Sampler)) &&
	    is_depth_image(type, id))
	{
		res += "Shadow";

		if (type.image.dim == DimCube && is_legacy())
		{
			if (!options.es)
				require_extension_internal("GL_EXT_gpu_shader4");
			else
			{
				require_extension_internal("GL_NV_shadow_samplers_cube");
				res += "NV";
			}
		}
	}

	return res;
}